

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_unittest.cc
# Opt level: O3

void Test_Demangle_CornerCases::RunTest(void)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  istream *piVar4;
  long lVar5;
  undefined8 extraout_RAX;
  ulong unaff_RBX;
  char tmp [10];
  char *pcStack_2e8;
  long lStack_2e0;
  char acStack_2d8 [16];
  char *apcStack_2c8 [2];
  char acStack_2b8 [16];
  char *apcStack_2a8 [2];
  char acStack_298 [16];
  undefined1 *apuStack_288 [2];
  undefined1 auStack_278 [16];
  long alStack_268 [4];
  byte abStack_248 [488];
  ulong uStack_60;
  int iStack_30;
  short sStack_2c;
  code *pcStack_20;
  ulong local_18;
  undefined2 local_10;
  
  local_10 = 0;
  local_18 = 0;
  pcStack_20 = (code *)0x109092;
  bVar1 = google::Demangle("_Z6foobarv",(char *)&local_18,10);
  if (bVar1) {
    unaff_RBX = 0x29287261626f6f66;
    if ((char)local_10 != '\0' || local_18 != 0x29287261626f6f66) goto LAB_00109143;
    pcStack_20 = (code *)0x1090cd;
    bVar1 = google::Demangle("_Z6foobarv",(char *)&local_18,9);
    if (!bVar1) goto LAB_00109148;
    unaff_RBX = local_18 ^ 0x29287261626f6f66;
    if ((char)local_10 != '\0' || unaff_RBX != 0) goto LAB_0010914d;
    pcStack_20 = (code *)0x1090f3;
    bVar1 = google::Demangle("_Z6foobarv",(char *)&local_18,8);
    if (bVar1) goto LAB_00109152;
    pcStack_20 = (code *)0x10910b;
    bVar1 = google::Demangle("_Z6foobarv",(char *)&local_18,1);
    if (bVar1) goto LAB_00109157;
    pcStack_20 = (code *)0x109120;
    bVar1 = google::Demangle("_Z6foobarv",(char *)&local_18,0);
    if (bVar1) goto LAB_0010915c;
    pcStack_20 = (code *)0x109134;
    bVar1 = google::Demangle("_Z6foobarv",(char *)0x0,0);
    if (!bVar1) {
      return;
    }
  }
  else {
    pcStack_20 = (code *)0x109143;
    RunTest();
LAB_00109143:
    pcStack_20 = (code *)0x109148;
    RunTest();
LAB_00109148:
    pcStack_20 = (code *)0x10914d;
    RunTest();
LAB_0010914d:
    pcStack_20 = (code *)0x109152;
    RunTest();
LAB_00109152:
    pcStack_20 = (code *)0x109157;
    RunTest();
LAB_00109157:
    pcStack_20 = (code *)0x10915c;
    RunTest();
LAB_0010915c:
    pcStack_20 = (code *)0x109161;
    RunTest();
  }
  pcStack_20 = Test_Demangle_Clones::RunTest;
  RunTest();
  bVar1 = google::Demangle("_ZL3Foov",(char *)&iStack_30,0x14);
  if (bVar1) {
    if (sStack_2c != 0x29 || iStack_30 != 0x286f6f46) goto LAB_001092d8;
    bVar1 = google::Demangle("_ZL3Foov.clone.3",(char *)&iStack_30,0x14);
    if (!bVar1) goto LAB_001092dd;
    if (sStack_2c != 0x29 || iStack_30 != 0x286f6f46) goto LAB_001092e2;
    bVar1 = google::Demangle("_ZL3Foov.constprop.80",(char *)&iStack_30,0x14);
    if (!bVar1) goto LAB_001092e7;
    if (sStack_2c != 0x29 || iStack_30 != 0x286f6f46) goto LAB_001092ec;
    bVar1 = google::Demangle("_ZL3Foov.isra.18",(char *)&iStack_30,0x14);
    if (!bVar1) goto LAB_001092f1;
    if (sStack_2c != 0x29 || iStack_30 != 0x286f6f46) goto LAB_001092f6;
    bVar1 = google::Demangle("_ZL3Foov.isra.2.constprop.18",(char *)&iStack_30,0x14);
    if (!bVar1) goto LAB_001092fb;
    if (sStack_2c != 0x29 || iStack_30 != 0x286f6f46) goto LAB_00109300;
    bVar1 = google::Demangle("_ZL3Foov.clo",(char *)&iStack_30,0x14);
    if (bVar1) goto LAB_00109305;
    bVar1 = google::Demangle("_ZL3Foov.clone.",(char *)&iStack_30,0x14);
    if (bVar1) goto LAB_0010930a;
    bVar1 = google::Demangle("_ZL3Foov.clone.foo",(char *)&iStack_30,0x14);
    if (!bVar1) {
      bVar1 = google::Demangle("_ZL3Foov.isra.2.constprop.",(char *)&iStack_30,0x14);
      if (!bVar1) {
        return;
      }
      goto LAB_00109314;
    }
  }
  else {
    Test_Demangle_Clones::RunTest();
LAB_001092d8:
    Test_Demangle_Clones::RunTest();
LAB_001092dd:
    Test_Demangle_Clones::RunTest();
LAB_001092e2:
    Test_Demangle_Clones::RunTest();
LAB_001092e7:
    Test_Demangle_Clones::RunTest();
LAB_001092ec:
    Test_Demangle_Clones::RunTest();
LAB_001092f1:
    Test_Demangle_Clones::RunTest();
LAB_001092f6:
    Test_Demangle_Clones::RunTest();
LAB_001092fb:
    Test_Demangle_Clones::RunTest();
LAB_00109300:
    Test_Demangle_Clones::RunTest();
LAB_00109305:
    Test_Demangle_Clones::RunTest();
LAB_0010930a:
    Test_Demangle_Clones::RunTest();
  }
  Test_Demangle_Clones::RunTest();
LAB_00109314:
  Test_Demangle_Clones::RunTest();
  apcStack_2c8[0] = acStack_2b8;
  uStack_60 = unaff_RBX;
  std::__cxx11::string::_M_construct<char*>
            ((string *)apcStack_2c8,fLS::FLAGS_test_srcdir_buf_abi_cxx11_,
             DAT_001309b8 + fLS::FLAGS_test_srcdir_buf_abi_cxx11_);
  std::__cxx11::string::append((char *)apcStack_2c8);
  std::ifstream::ifstream((istream *)alStack_268,apcStack_2c8[0],_S_in);
  if ((abStack_248[*(long *)(alStack_268[0] + -0x18)] & 5) == 0) {
    pcStack_2e8 = acStack_2d8;
    lStack_2e0 = 0;
    acStack_2d8[0] = '\0';
    while( true ) {
      do {
        cVar2 = std::ios::widen((char)*(undefined8 *)(alStack_268[0] + -0x18) +
                                (char)(istream *)alStack_268);
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)alStack_268,(string *)&pcStack_2e8,cVar2);
        if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
          if (pcStack_2e8 != acStack_2d8) {
            free(pcStack_2e8);
          }
          std::ifstream::~ifstream(alStack_268);
          if (apcStack_2c8[0] != acStack_2b8) {
            free(apcStack_2c8[0]);
          }
          return;
        }
      } while ((lStack_2e0 == 0) || (*pcStack_2e8 == '#'));
      lVar5 = std::__cxx11::string::find((char)&pcStack_2e8,9);
      if (lVar5 == -1) break;
      std::__cxx11::string::substr((ulong)apcStack_2a8,(ulong)&pcStack_2e8);
      std::__cxx11::string::substr((ulong)apuStack_288,(ulong)&pcStack_2e8);
      google::Demangle(apcStack_2a8[0],DemangleIt(char_const*)::demangled,0x1000);
      iVar3 = std::__cxx11::string::compare((char *)apuStack_288);
      if (iVar3 != 0) goto LAB_001094f9;
      if (apuStack_288[0] != auStack_278) {
        free(apuStack_288[0]);
      }
      if (apcStack_2a8[0] != acStack_298) {
        free(apcStack_2a8[0]);
      }
    }
    Test_Demangle_FromFile::RunTest();
LAB_001094f9:
    Test_Demangle_FromFile::RunTest();
  }
  Test_Demangle_FromFile::RunTest();
  if (apcStack_2c8[0] != acStack_2b8) {
    free(apcStack_2c8[0]);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(Demangle, CornerCases) {
  const size_t size = 10;
  char tmp[size] = {0};
  const char* demangled = "foobar()";
  const char* mangled = "_Z6foobarv";
  EXPECT_TRUE(Demangle(mangled, tmp, sizeof(tmp)));
  // sizeof("foobar()") == size - 1
  EXPECT_STREQ(demangled, tmp);
  EXPECT_TRUE(Demangle(mangled, tmp, size - 1));
  EXPECT_STREQ(demangled, tmp);
  EXPECT_FALSE(Demangle(mangled, tmp, size - 2));  // Not enough.
  EXPECT_FALSE(Demangle(mangled, tmp, 1));
  EXPECT_FALSE(Demangle(mangled, tmp, 0));
  EXPECT_FALSE(Demangle(mangled, nullptr, 0));  // Should not cause SEGV.
}